

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
fasttext::FastText::getNNMod
          (vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,FastText *this,string *word,int32_t k,int factor,bool addWo)

{
  int32_t iVar1;
  DenseMatrix *this_00;
  DenseMatrix *pDVar2;
  undefined7 in_register_00000089;
  long lVar3;
  real rVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_aa;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_a9;
  int32_t local_a8;
  float local_a4;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_a0;
  Vector vec;
  Vector query;
  string word_1;
  
  local_a8 = k;
  Vector::Vector(&query,(long)((this->args_).
                               super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                              )->dim);
  local_a4 = (float)(int)CONCAT71(in_register_00000089,addWo);
  getWordVector(this,&query,word,factor,local_a4);
  pDVar2 = (this->wordVectorsMod)._M_t.
           super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
           ._M_t.
           super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>
           .super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl;
  if (pDVar2 == (DenseMatrix *)0x0) {
    this_00 = (DenseMatrix *)operator_new(0x30);
    iVar1 = Dictionary::nwords((this->dict_).
                               super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    DenseMatrix::DenseMatrix
              (this_00,(long)iVar1,
               (long)((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->dim);
    pDVar2 = (this->wordVectorsMod)._M_t.
             super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
             ._M_t.
             super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>
             .super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl;
    (this->wordVectorsMod)._M_t.
    super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>._M_t.
    super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>.
    super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl = this_00;
    if (pDVar2 != (DenseMatrix *)0x0) {
      (**(code **)((long)(pDVar2->super_Matrix)._vptr_Matrix + 8))();
    }
    Vector::Vector(&vec,(long)((this->args_).
                               super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                              )->dim);
    local_a0 = __return_storage_ptr__;
    DenseMatrix::zero((this->wordVectorsMod)._M_t.
                      super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>
                      .super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl);
    lVar3 = 0;
    while( true ) {
      iVar1 = Dictionary::nwords((this->dict_).
                                 super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
      if (iVar1 <= lVar3) break;
      Dictionary::getWord_abi_cxx11_
                (&word_1,(this->dict_).
                         super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,(int32_t)lVar3);
      getWordVector(this,&vec,&word_1,factor,local_a4);
      rVar4 = Vector::norm(&vec);
      if (0.0 < rVar4) {
        pDVar2 = (this->wordVectorsMod)._M_t.
                 super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>
                 .super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl;
        (**(code **)((long)(pDVar2->super_Matrix)._vptr_Matrix + 0x18))
                  (1.0 / rVar4,pDVar2,&vec,lVar3);
      }
      std::__cxx11::string::~string((string *)&word_1);
      lVar3 = lVar3 + 1;
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&vec);
    pDVar2 = (this->wordVectorsMod)._M_t.
             super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
             ._M_t.
             super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>
             .super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl;
    __return_storage_ptr__ = local_a0;
  }
  std::__cxx11::string::string((string *)&vec,(string *)word);
  __l._M_len = 1;
  __l._M_array = (iterator)&vec;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&word_1,__l,&local_a9,&local_aa);
  getNN(__return_storage_ptr__,this,pDVar2,&query,local_a8,
        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&word_1);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&word_1);
  std::__cxx11::string::~string((string *)&vec);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&query);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<real, std::string>> FastText::getNNMod(const std::string &word, int32_t k, int factor, bool addWo) {
    Vector query(args_->dim);
    getWordVector(query, word, factor, addWo);
    if (!wordVectorsMod) {
        wordVectorsMod = std::unique_ptr<DenseMatrix>(
                new DenseMatrix(dict_->nwords(), args_->dim));
        Vector vec(args_->dim);

        wordVectorsMod->zero();
        for (int32_t i = 0; i < dict_->nwords(); i++) {
            std::string word = dict_->getWord(i);
            getWordVector(vec, word,factor, addWo);
            real norm = vec.norm();
            if (norm > 0) {
                wordVectorsMod->addVectorToRow(vec, i, 1.0 / norm);
            }
        }
    }
    return getNN(*wordVectorsMod, query, k, {word});
}